

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_CallConstructorInternal
                  (JSContext *ctx,JSValue func_obj,JSValue new_target,int argc,JSValue *argv,
                  int flags)

{
  JSClassCall *pJVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  char *fmt;
  uint uVar6;
  JSValue this_obj;
  JSValue JVar7;
  JSValue JVar8;
  
  JVar5 = func_obj.u;
  iVar2 = ctx->interrupt_counter;
  ctx->interrupt_counter = iVar2 + -1;
  if ((1 < iVar2) || (iVar2 = __js_poll_interrupts(ctx), iVar2 == 0)) {
    if ((int)func_obj.tag == -1) {
      if ((*(byte *)((long)JVar5.ptr + 5) & 0x10) != 0) {
        uVar6 = flags | 1;
        if ((ulong)*(ushort *)((long)JVar5.ptr + 6) == 0xd) {
          if ((*(byte *)(*(long *)((long)JVar5.ptr + 0x30) + 0x19) & 4) != 0) {
            JVar7 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target,argc,argv,
                                    uVar6);
            goto LAB_0012ae22;
          }
          this_obj = js_create_from_ctor(ctx,new_target,1);
          JVar3 = this_obj.u;
          if ((uint)this_obj.tag == 6) goto LAB_0012aded;
          JVar7 = JS_CallInternal(ctx,func_obj,this_obj,new_target,argc,argv,uVar6);
          JVar5 = JVar7.u;
          uVar6 = (uint)JVar7.tag;
          if ((uVar6 != 6) && (uVar6 != 0xffffffff)) {
            if ((0xfffffff4 < uVar6) &&
               (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar7);
            }
            uVar4 = (ulong)JVar3.ptr & 0xffffffff00000000;
            goto LAB_0012aebd;
          }
          if ((0xfffffff4 < (uint)this_obj.tag) &&
             (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,this_obj);
          }
          JVar3.float64 = -NAN;
        }
        else {
          pJVar1 = ctx->rt->class_array[*(ushort *)((long)JVar5.ptr + 6)].call;
          if (pJVar1 == (JSClassCall *)0x0) goto LAB_0012af72;
          JVar7 = (*pJVar1)(ctx,func_obj,new_target,argc,argv,uVar6);
LAB_0012ae22:
          JVar3 = JVar7.u;
          JVar7.tag = JVar7.tag;
          JVar7.u.float64 = -NAN;
          JVar5 = JVar3;
        }
        this_obj.tag = JVar7.tag;
        this_obj.u.ptr = JVar5.ptr;
        uVar4 = (ulong)JVar7.u.ptr & (ulong)JVar3.ptr;
        goto LAB_0012aebd;
      }
      fmt = "not a constructor";
    }
    else {
LAB_0012af72:
      fmt = "not a function";
    }
    JS_ThrowTypeError(ctx,fmt);
  }
LAB_0012aded:
  this_obj = (JSValue)(ZEXT816(6) << 0x40);
  uVar4 = 0;
LAB_0012aebd:
  JVar8.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar4);
  JVar8.tag = this_obj.tag;
  return JVar8;
}

Assistant:

static JSValue JS_CallConstructorInternal(JSContext *ctx,
                                          JSValueConst func_obj,
                                          JSValueConst new_target,
                                          int argc, JSValue *argv, int flags)
{
    JSObject *p;
    JSFunctionBytecode *b;

    if (js_poll_interrupts(ctx))
        return JS_EXCEPTION;
    flags |= JS_CALL_FLAG_CONSTRUCTOR;
    if (unlikely(JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT))
        goto not_a_function;
    p = JS_VALUE_GET_OBJ(func_obj);
    if (unlikely(!p->is_constructor))
        return JS_ThrowTypeError(ctx, "not a constructor");
    if (unlikely(p->class_id != JS_CLASS_BYTECODE_FUNCTION)) {
        JSClassCall *call_func;
        call_func = ctx->rt->class_array[p->class_id].call;
        if (!call_func) {
        not_a_function:
            return JS_ThrowTypeError(ctx, "not a function");
        }
        return call_func(ctx, func_obj, new_target, argc,
                         (JSValueConst *)argv, flags);
    }

    b = p->u.func.function_bytecode;
    if (b->is_derived_class_constructor) {
        return JS_CallInternal(ctx, func_obj, JS_UNDEFINED, new_target, argc, argv, flags);
    } else {
        JSValue obj, ret;
        /* legacy constructor behavior */
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_OBJECT);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        ret = JS_CallInternal(ctx, func_obj, obj, new_target, argc, argv, flags);
        if (JS_VALUE_GET_TAG(ret) == JS_TAG_OBJECT ||
            JS_IsException(ret)) {
            JS_FreeValue(ctx, obj);
            return ret;
        } else {
            JS_FreeValue(ctx, ret);
            return obj;
        }
    }
}